

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_algor.cc
# Opt level: O3

int X509_ALGOR_cmp(X509_ALGOR *a,X509_ALGOR *b)

{
  int iVar1;
  
  iVar1 = OBJ_cmp(a->algorithm,b->algorithm);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (a->parameter != (ASN1_TYPE *)0x0 || b->parameter != (ASN1_TYPE *)0x0) {
      iVar1 = ASN1_TYPE_cmp(a->parameter,b->parameter);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int X509_ALGOR_cmp(const X509_ALGOR *a, const X509_ALGOR *b) {
  int rv;
  rv = OBJ_cmp(a->algorithm, b->algorithm);
  if (rv) {
    return rv;
  }
  if (!a->parameter && !b->parameter) {
    return 0;
  }
  return ASN1_TYPE_cmp(a->parameter, b->parameter);
}